

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

complex<double> __thiscall soul::Value::PackedData::getAs<std::complex<double>>(PackedData *this)

{
  undefined8 in_RDX;
  complex<double> cVar1;
  
  if (this->size == 0x10) {
    cVar1._M_value._8_8_ = in_RDX;
    cVar1._M_value._0_8_ = this->data;
    return (complex<double>)cVar1._M_value;
  }
  throwInternalCompilerError("size == sizeof (Primitive)","getAs",0x15e);
}

Assistant:

Primitive getAs() const                 { SOUL_ASSERT (size == sizeof (Primitive)); return readUnaligned<Primitive> (data); }